

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O0

bool PromProgramCallback(char *msg)

{
  ostream *poVar1;
  double dVar2;
  double t;
  char *msg_local;
  
  if (msg == (char *)0x0) {
    dVar2 = Amp1394_GetTime();
    if (0.1 < dVar2 - Callback_StartTime) {
      poVar1 = std::operator<<((ostream *)&std::cout,".");
      std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
      Callback_StartTime = dVar2;
    }
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,msg);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return true;
}

Assistant:

bool PromProgramCallback(const char *msg)
{
    if (msg) std::cout << std::endl << msg << std::endl;
    else {
        double t = Amp1394_GetTime();
        if ((t - Callback_StartTime) > 0.1) {
            std::cout << "." << std::flush;
            Callback_StartTime = t;
        }
    }
    return true;   // continue
}